

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O3

void __thiscall
ast::Dir_ascii::Dir_ascii
          (Dir_ascii *this,uint asciz,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sl,Location left)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  uint8_t *local_50;
  uint local_48;
  uint8_t local_40 [16];
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  (this->super_Directive).super_Statement.location.unit = left.unit;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement.size_in_memory = 0;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_ascii_0013c840;
  this->string_list = sl;
  lVar1 = Sections::current_section;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  uVar2 = *(uint *)(lVar1 + 0x30);
  (this->super_Directive).super_Statement.section_offset = uVar2;
  p_Var4 = (sl->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  uVar3 = uVar2;
  if (p_Var4 != (_List_node_base *)sl) {
    do {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,p_Var4[1]._M_next,
                 (long)&(p_Var4[1]._M_prev)->_M_next + (long)p_Var4[1]._M_next);
      Sections::append_block(*(uint *)(Sections::current_section + 0x20),local_50,local_48);
      if (asciz != 0) {
        Sections::append8(*(uint *)(Sections::current_section + 0x20),'\0');
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)sl);
    uVar3 = *(uint *)(Sections::current_section + 0x30);
    uVar2 = (this->super_Directive).super_Statement.section_offset;
  }
  (this->super_Directive).super_Statement.size_in_memory = uVar3 - uVar2;
  return;
}

Assistant:

Dir_ascii::Dir_ascii(unsigned asciz, list<string> *sl, Location left) :
	Directive {left}, string_list {sl}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	for (auto s: *string_list) {
		Sections::append_block(Sections::current_section->number, (const uint8_t *)s.data(), s.size());
		if (asciz)
			Sections::append8(Sections::current_section->number, 0);
	}
	size_in_memory = Sections::current_section->content_size - section_offset;
}